

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

int ConvexDecomposition::calchull
              (float3 *verts,int verts_count,int **tris_out,int *tris_count,int vlimit)

{
  cbtHullTriangle *this;
  int iVar1;
  cbtHullTriangle **ppcVar2;
  int i;
  int j;
  long lVar3;
  Array<int> local_48;
  
  iVar1 = calchullgen(verts,verts_count,vlimit);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    local_48.element = (int *)0x0;
    local_48.count = 0;
    local_48.array_size = 0;
    for (iVar1 = 0; iVar1 < (int)tris._8_4_; iVar1 = iVar1 + 1) {
      ppcVar2 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                          ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar1);
      if (*ppcVar2 != (cbtHullTriangle *)0x0) {
        lVar3 = 0;
        while( true ) {
          ppcVar2 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                              ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar1);
          this = *ppcVar2;
          if (lVar3 == 3) break;
          Array<int>::Add(&local_48,(&(this->super_int3).x)[lVar3]);
          lVar3 = lVar3 + 1;
        }
        if (this != (cbtHullTriangle *)0x0) {
          cbtHullTriangle::~cbtHullTriangle(this);
        }
        ::operator_delete(this,0x24);
      }
    }
    *tris_count = local_48.count / 3;
    *tris_out = local_48.element;
    tris._8_4_ = 0;
    local_48.element = (int *)0x0;
    local_48.count = 0;
    local_48.array_size = 0;
    Array<int>::~Array(&local_48);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int calchull(float3 *verts,int verts_count, int *&tris_out, int &tris_count,int vlimit) 
{
	int rc=calchullgen(verts,verts_count,  vlimit) ;
	if(!rc) return 0;
	Array<int> ts;
	for(int i=0;i<tris.count;i++)if(tris[i])
	{
		for(int j=0;j<3;j++)ts.Add((*tris[i])[j]);
		delete tris[i];
	}
	tris_count = ts.count/3;
	tris_out   = ts.element;
	ts.element=NULL; ts.count=ts.array_size=0;
	tris.count=0;
	return 1;
}